

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::BasicReporter::NoAssertionsInTestCase(BasicReporter *this,string *testName)

{
  ostream *poVar1;
  undefined1 local_28 [8];
  TextColour colour;
  string *testName_local;
  BasicReporter *this_local;
  
  colour.m_impl = (ConsoleColourImpl *)testName;
  startSpansLazily(this);
  TextColour::TextColour((TextColour *)local_28,ResultError);
  poVar1 = std::operator<<((this->m_config).stream,"\nNo assertions in test case, \'");
  poVar1 = std::operator<<(poVar1,(string *)colour.m_impl);
  poVar1 = std::operator<<(poVar1,"\'\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  TextColour::~TextColour((TextColour *)local_28);
  return;
}

Assistant:

virtual void NoAssertionsInTestCase( const std::string& testName ) {
            startSpansLazily();
            TextColour colour( TextColour::ResultError );
            m_config.stream << "\nNo assertions in test case, '" << testName << "'\n" << std::endl;
        }